

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O1

MockSupport * __thiscall MockSupport::getMockSupport(MockSupport *this,MockNamedValueListNode *node)

{
  bool bVar1;
  int iVar2;
  MockNamedValue *pMVar3;
  undefined4 extraout_var;
  SimpleString SStack_58;
  SimpleString local_48;
  SimpleString local_38;
  SimpleString local_28;
  MockSupport *pMVar4;
  
  MockNamedValueListNode::getType((MockNamedValueListNode *)&local_28);
  SimpleString::SimpleString(&local_38,"MockSupport");
  bVar1 = operator==(&local_28,&local_38);
  if (bVar1) {
    MockNamedValueListNode::getName((MockNamedValueListNode *)&local_48);
    SimpleString::SimpleString(&SStack_58,"!!!$$$MockingSupportScope$$$!!!");
    bVar1 = SimpleString::contains(&local_48,&SStack_58);
    SimpleString::~SimpleString(&SStack_58);
    SimpleString::~SimpleString(&local_48);
  }
  else {
    bVar1 = false;
  }
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  if (bVar1 == false) {
    pMVar4 = (MockSupport *)0x0;
  }
  else {
    pMVar3 = MockNamedValueListNode::item(node);
    iVar2 = (*pMVar3->_vptr_MockNamedValue[0x28])(pMVar3);
    pMVar4 = (MockSupport *)CONCAT44(extraout_var,iVar2);
  }
  return pMVar4;
}

Assistant:

MockSupport* MockSupport::getMockSupport(MockNamedValueListNode* node)
{
    if (node->getType() == "MockSupport" && node->getName().contains(MOCK_SUPPORT_SCOPE_PREFIX))
        return (MockSupport*) node->item()->getObjectPointer();
    return NULLPTR;
}